

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void SuperSpread_Test_Speed<4u>(string *PATH)

{
  ostream *poVar1;
  int *piVar2;
  double duration_4;
  TP finish_4;
  TP start_4;
  int num_4;
  Data<4U> *records_4;
  int cnt_4;
  SpreadSketchWrapper<4U> sketch_4;
  int k_4;
  double duration_3;
  TP finish_3;
  TP start_3;
  int num_3;
  Data<4U> *records_3;
  int cnt_3;
  OpenSketch<4U> sketch_3;
  int k_3;
  double duration_2;
  TP finish_2;
  TP start_2;
  int num_2;
  Data<4U> *records_2;
  int cnt_2;
  OLF<4U> sketch_2;
  int k_2;
  double duration_1;
  TP finish_1;
  TP start_1;
  int num_1;
  Data<4U> *records_1;
  int cnt_1;
  TLF<4U> sketch_1;
  int k_1;
  double duration;
  TP finish;
  TP start;
  int num;
  Data<4U> *records;
  int cnt;
  WavingSketch<8U,_16U,_4U> sketch;
  int k;
  int memory;
  int i;
  ofstream out;
  string file;
  Data<4U> to;
  Data<4U> from;
  int CYCLE;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffff598;
  TLF<4U> *in_stack_fffffffffffff5a0;
  ostream *in_stack_fffffffffffff5a8;
  SpreadSketchWrapper<4U> *in_stack_fffffffffffff5b0;
  ostream *in_stack_fffffffffffff5b8;
  OLF<4U> *in_stack_fffffffffffff5c0;
  __enable_if_is_duration<std::chrono::duration<double,_std::ratio<1L,_1000000L>_>_>
  in_stack_fffffffffffff5c8;
  type in_stack_fffffffffffff5d0;
  TP in_stack_fffffffffffff5d8;
  OLF<4U> *in_stack_fffffffffffff5e0;
  Data<4U> *in_stack_fffffffffffff5e8;
  TP in_stack_fffffffffffff5f0;
  Data<4U> *in_stack_fffffffffffff5f8;
  OpenSketch<4U> *in_stack_fffffffffffff600;
  TP in_stack_fffffffffffff638;
  OpenSketch<4U> *in_stack_fffffffffffff640;
  TP in_stack_fffffffffffff650;
  Data<4U> *in_stack_fffffffffffff658;
  int interval;
  ostream *in_stack_fffffffffffff660;
  duration<double,_std::ratio<1L,_1000000L>_> local_810;
  OLF<4U> *local_808;
  duration local_800;
  duration local_7f8;
  int local_7ec;
  Data<4U> *local_7e8;
  int local_7dc [3];
  string local_7d0 [64];
  string local_790 [52];
  int local_75c;
  rep_conflict local_758;
  duration<double,_std::ratio<1L,_1000000L>_> local_750;
  rep local_748;
  duration local_740;
  duration local_738;
  int local_72c;
  Data<4U> *local_728;
  int local_71c [3];
  string local_710 [64];
  string local_6d0 [140];
  int local_644;
  rep_conflict local_640;
  duration<double,_std::ratio<1L,_1000000L>_> local_638;
  rep local_630;
  duration local_628;
  duration local_620;
  int local_614;
  Data<4U> *local_610;
  int local_604 [3];
  string local_5f8 [64];
  string local_5b8 [164];
  int local_514;
  rep_conflict local_510;
  duration<double,_std::ratio<1L,_1000000L>_> local_508;
  rep local_500;
  duration local_4f8;
  duration local_4f0;
  int local_4e4;
  Data<4U> *local_4e0;
  int local_4d4 [3];
  string local_4c8 [64];
  string local_488 [220];
  int local_3ac;
  rep_conflict local_3a8;
  duration<double,_std::ratio<1L,_1000000L>_> local_3a0;
  rep local_398;
  duration local_390;
  duration local_388;
  int local_37c;
  Data<4U> *local_378;
  int local_36c [3];
  string local_360 [64];
  string local_320 [100];
  int local_2bc;
  int local_2b8;
  int local_2b4;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  ostream local_250 [535];
  allocator local_39;
  string local_38 [36];
  Data<4U> local_14;
  undefined4 local_c;
  
  local_c = 1;
  Data<4U>::Data((Data<4U> *)0x10e8ff);
  Data<4U>::Data((Data<4U> *)0x10e90c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"caida",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5c8.__r,(char *)in_stack_fffffffffffff5c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0);
  std::ofstream::ofstream(local_250,local_270,0x10);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2b0);
  for (local_2b4 = 0; local_2b4 < 5; local_2b4 = local_2b4 + 1) {
    local_2b8 = local_2b4 * 100000 + 600000;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)(uint)(local_2b8 / 1000));
    if (local_2b4 == 0) {
      poVar1 = std::operator<<(local_250,"MEM(KB)");
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = std::operator<<(poVar1,"WavingSketch<8,1>");
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = std::operator<<(poVar1,"TLF");
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = std::operator<<(poVar1,"OLF");
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = std::operator<<(poVar1,"opensketch");
      poVar1 = std::operator<<(poVar1,",");
      std::operator<<(poVar1,"SpreadSketch");
      std::ostream::operator<<(local_250,std::endl<char,std::char_traits<char>>);
    }
    poVar1 = (ostream *)std::ostream::operator<<(local_250,local_2b8 / 1000);
    std::operator<<(poVar1,",");
    for (local_2bc = 0; local_2bc < 1; local_2bc = local_2bc + 1) {
      WavingSketch<8U,_16U,_4U>::WavingSketch
                ((WavingSketch<8U,_16U,_4U> *)in_stack_fffffffffffff5f0.__d.__r,
                 (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),(int)in_stack_fffffffffffff5e8,
                 (uint32_t)((ulong)in_stack_fffffffffffff5e0 >> 0x20));
      std::__cxx11::string::c_str();
      local_378 = read_standard_pair_data<4u>
                            ((char *)in_stack_fffffffffffff660,
                             (int)((ulong)in_stack_fffffffffffff658 >> 0x20),
                             (int *)in_stack_fffffffffffff650.__d.__r);
      local_37c = 0;
      local_388.__r = (rep_conflict)now();
      piVar2 = std::min<int>(local_36c,&MAX_PACKET);
      local_36c[0] = *piVar2;
      while (local_37c < local_36c[0]) {
        Data<4U>::operator=((Data<4U> *)&stack0xfffffffffffffff0,local_378 + local_37c * 2);
        Data<4U>::operator=(&local_14,local_378 + (long)(local_37c * 2) + 1);
        local_37c = local_37c + 1;
        WavingSketch<8U,_16U,_4U>::Init
                  ((WavingSketch<8U,_16U,_4U> *)in_stack_fffffffffffff5c0,
                   (Data<4U> *)in_stack_fffffffffffff5b8,(Data<4U> *)in_stack_fffffffffffff5b0);
      }
      local_390.__r = (rep_conflict)now();
      local_3a8 = (rep_conflict)
                  std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a8,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a0);
      local_3a0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<double,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_fffffffffffff598);
      local_398 = std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count(&local_3a0);
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      poVar1 = std::operator<<((ostream *)&std::cout,local_360);
      poVar1 = std::operator<<(poVar1,local_320);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,((double)local_37c + 0.0) / local_398);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = (ostream *)std::ostream::operator<<(local_250,((double)local_37c + 0.0) / local_398);
      std::operator<<(poVar1,",");
      free(local_378);
      WavingSketch<8U,_16U,_4U>::~WavingSketch
                ((WavingSketch<8U,_16U,_4U> *)in_stack_fffffffffffff5a0);
    }
    for (local_3ac = 0; local_3ac < 1; local_3ac = local_3ac + 1) {
      TLF<4U>::TLF((TLF<4U> *)in_stack_fffffffffffff5d0.__r,
                   (int)((ulong)in_stack_fffffffffffff5c8.__r >> 0x20),
                   SUB84(in_stack_fffffffffffff5c8.__r,0));
      std::__cxx11::string::c_str();
      local_4e0 = read_standard_pair_data<4u>
                            ((char *)in_stack_fffffffffffff660,
                             (int)((ulong)in_stack_fffffffffffff658 >> 0x20),
                             (int *)in_stack_fffffffffffff650.__d.__r);
      local_4e4 = 0;
      local_4f0.__r = (rep_conflict)now();
      piVar2 = std::min<int>(local_4d4,&MAX_PACKET);
      local_4d4[0] = *piVar2;
      while (local_4e4 < local_4d4[0]) {
        Data<4U>::operator=((Data<4U> *)&stack0xfffffffffffffff0,local_4e0 + local_4e4 * 2);
        Data<4U>::operator=(&local_14,local_4e0 + (long)(local_4e4 * 2) + 1);
        local_4e4 = local_4e4 + 1;
        TLF<4U>::Init((TLF<4U> *)in_stack_fffffffffffff5f0.__d.__r,in_stack_fffffffffffff5e8,
                      (Data<4U> *)in_stack_fffffffffffff5e0);
      }
      local_4f8.__r = (rep_conflict)now();
      local_510 = (rep_conflict)
                  std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a8,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a0);
      local_508.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<double,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_fffffffffffff598);
      local_500 = std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count(&local_508);
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      poVar1 = std::operator<<((ostream *)&std::cout,local_4c8);
      poVar1 = std::operator<<(poVar1,local_488);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,((double)local_4e4 + 0.0) / local_500);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = (ostream *)std::ostream::operator<<(local_250,((double)local_4e4 + 0.0) / local_500);
      std::operator<<(poVar1,",");
      free(local_4e0);
      TLF<4U>::~TLF(in_stack_fffffffffffff5a0);
    }
    for (local_514 = 0; local_514 < 1; local_514 = local_514 + 1) {
      OLF<4U>::OLF(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                   (int)in_stack_fffffffffffff5b8);
      std::__cxx11::string::c_str();
      local_610 = read_standard_pair_data<4u>
                            ((char *)in_stack_fffffffffffff660,
                             (int)((ulong)in_stack_fffffffffffff658 >> 0x20),
                             (int *)in_stack_fffffffffffff650.__d.__r);
      local_614 = 0;
      local_620.__r = (rep_conflict)now();
      piVar2 = std::min<int>(local_604,&MAX_PACKET);
      local_604[0] = *piVar2;
      while (local_614 < local_604[0]) {
        Data<4U>::operator=((Data<4U> *)&stack0xfffffffffffffff0,local_610 + local_614 * 2);
        Data<4U>::operator=(&local_14,local_610 + (long)(local_614 * 2) + 1);
        local_614 = local_614 + 1;
        OLF<4U>::Init(in_stack_fffffffffffff5e0,(Data<4U> *)in_stack_fffffffffffff5d8.__d.__r,
                      (Data<4U> *)in_stack_fffffffffffff5d0.__r);
      }
      local_628.__r = (rep_conflict)now();
      local_640 = (rep_conflict)
                  std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a8,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a0);
      local_638.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<double,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_fffffffffffff598);
      local_630 = std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count(&local_638);
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      poVar1 = std::operator<<((ostream *)&std::cout,local_5f8);
      poVar1 = std::operator<<(poVar1,local_5b8);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,((double)local_614 + 0.0) / local_630);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff660 =
           (ostream *)std::ostream::operator<<(local_250,((double)local_614 + 0.0) / local_630);
      std::operator<<(in_stack_fffffffffffff660,",");
      free(local_610);
      OLF<4U>::~OLF((OLF<4U> *)in_stack_fffffffffffff5a0);
    }
    for (local_644 = 0; interval = (int)((ulong)in_stack_fffffffffffff658 >> 0x20), local_644 < 1;
        local_644 = local_644 + 1) {
      OpenSketch<4U>::OpenSketch
                (in_stack_fffffffffffff640,(int)((ulong)in_stack_fffffffffffff638.__d.__r >> 0x20),
                 SUB84(in_stack_fffffffffffff638.__d.__r,0));
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff658 =
           read_standard_pair_data<4u>
                     ((char *)in_stack_fffffffffffff660,interval,
                      (int *)in_stack_fffffffffffff650.__d.__r);
      local_72c = 0;
      local_728 = in_stack_fffffffffffff658;
      in_stack_fffffffffffff650 = now();
      local_738 = in_stack_fffffffffffff650.__d.__r;
      piVar2 = std::min<int>(local_71c,&MAX_PACKET);
      local_71c[0] = *piVar2;
      while (local_72c < local_71c[0]) {
        in_stack_fffffffffffff640 = (OpenSketch<4U> *)&stack0xfffffffffffffff0;
        Data<4U>::operator=((Data<4U> *)in_stack_fffffffffffff640,local_728 + local_72c * 2);
        Data<4U>::operator=(&local_14,local_728 + (long)(local_72c * 2) + 1);
        local_72c = local_72c + 1;
        OpenSketch<4U>::Init
                  (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   (Data<4U> *)in_stack_fffffffffffff5f0.__d.__r);
      }
      in_stack_fffffffffffff638 = now();
      local_740 = in_stack_fffffffffffff638.__d.__r;
      local_758 = (rep_conflict)
                  std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a8,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff5a0);
      local_750.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<double,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_fffffffffffff598);
      local_748 = std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count(&local_750);
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      poVar1 = std::operator<<((ostream *)&std::cout,local_710);
      poVar1 = std::operator<<(poVar1,local_6d0);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,((double)local_72c + 0.0) / local_748);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff600 =
           (OpenSketch<4U> *)
           std::ostream::operator<<(local_250,((double)local_72c + 0.0) / local_748);
      std::operator<<((ostream *)in_stack_fffffffffffff600,",");
      free(local_728);
      OpenSketch<4U>::~OpenSketch((OpenSketch<4U> *)in_stack_fffffffffffff5d0.__r);
    }
    for (local_75c = 0; local_75c < 1; local_75c = local_75c + 1) {
      SpreadSketchWrapper<4U>::SpreadSketchWrapper
                ((SpreadSketchWrapper<4U> *)in_stack_fffffffffffff5d0.__r,
                 (int)((ulong)in_stack_fffffffffffff5c8.__r >> 0x20),
                 SUB84(in_stack_fffffffffffff5c8.__r,0));
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff5f8 =
           read_standard_pair_data<4u>
                     ((char *)in_stack_fffffffffffff660,
                      (int)((ulong)in_stack_fffffffffffff658 >> 0x20),
                      (int *)in_stack_fffffffffffff650.__d.__r);
      local_7ec = 0;
      local_7e8 = in_stack_fffffffffffff5f8;
      in_stack_fffffffffffff5f0 = now();
      local_7f8 = in_stack_fffffffffffff5f0.__d.__r;
      piVar2 = std::min<int>(local_7dc,&MAX_PACKET);
      local_7dc[0] = *piVar2;
      while (local_7ec < local_7dc[0]) {
        in_stack_fffffffffffff5e0 = (OLF<4U> *)&stack0xfffffffffffffff0;
        Data<4U>::operator=((Data<4U> *)in_stack_fffffffffffff5e0,local_7e8 + local_7ec * 2);
        in_stack_fffffffffffff5e8 = &local_14;
        Data<4U>::operator=(in_stack_fffffffffffff5e8,local_7e8 + (long)(local_7ec * 2) + 1);
        local_7ec = local_7ec + 1;
        SpreadSketchWrapper<4U>::Init
                  (in_stack_fffffffffffff5b0,(Data<4U> *)in_stack_fffffffffffff5a8,
                   (Data<4U> *)in_stack_fffffffffffff5a0);
      }
      in_stack_fffffffffffff5d8 = now();
      local_800 = in_stack_fffffffffffff5d8.__d.__r;
      in_stack_fffffffffffff5d0 =
           std::chrono::operator-
                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffff5a8,
                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffff5a0);
      in_stack_fffffffffffff5c8 =
           std::chrono::
           duration_cast<std::chrono::duration<double,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                     (in_stack_fffffffffffff598);
      local_810.__r = in_stack_fffffffffffff5c8.__r;
      in_stack_fffffffffffff5c0 =
           (OLF<4U> *)std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count(&local_810);
      local_808 = in_stack_fffffffffffff5c0;
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      in_stack_fffffffffffff5b8 = std::operator<<((ostream *)&std::cout,local_7d0);
      in_stack_fffffffffffff5b0 =
           (SpreadSketchWrapper<4U> *)std::operator<<(in_stack_fffffffffffff5b8,local_790);
      in_stack_fffffffffffff5a8 =
           (ostream *)
           std::ostream::operator<<
                     ((ostream *)in_stack_fffffffffffff5b0,
                      ((double)local_7ec + 0.0) / (double)local_808);
      std::ostream::operator<<(in_stack_fffffffffffff5a8,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff5a0 =
           (TLF<4U> *)
           std::ostream::operator<<(local_250,((double)local_7ec + 0.0) / (double)local_808);
      std::operator<<((ostream *)in_stack_fffffffffffff5a0,",");
      free(local_7e8);
      SpreadSketchWrapper<4U>::~SpreadSketchWrapper
                ((SpreadSketchWrapper<4U> *)in_stack_fffffffffffff5a0);
    }
    std::ostream::operator<<(local_250,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(local_250);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SuperSpread_Test_Speed(string PATH) {
	const int CYCLE = 1;
	Data<DATA_LEN> from;
	Data<DATA_LEN> to;
	std::string file = "caida";
	std::ofstream out(RESULT_FOLDER + "superSpread_" + file + "_Throughput(Mops).csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 6 * SuperSpread_BLOCK + SuperSpread_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);

		if (i == 0)
		{
			out << "MEM(KB)" << "," << "WavingSketch<8,1>" << "," << "TLF" << ","
				<< "OLF" << "," << "opensketch" << "," << "SpreadSketch";
			out << std::endl;
		}
		out << memory / 1000 << ",";

		for (int k = 0; k < CYCLE; ++k) {
			WavingSketch<8, 16, DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			TLF<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			OLF<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			OpenSketch<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			SpreadSketchWrapper<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}
		out << endl;
	}
}